

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float32 helper_rsqrte_f32_aarch64(float32 input,void *fpstp)

{
  uint32_t uVar1;
  int iVar2;
  uint64_t uVar3;
  float32 local_44;
  float32 nan;
  uint64_t f64_frac;
  uint32_t local_30;
  uint32_t f32_frac;
  int f32_exp;
  uint32_t f32_sign;
  uint32_t val;
  float32 f32;
  float_status *s;
  void *fpstp_local;
  float32 input_local;
  
  _val = (float_status *)fpstp;
  s = (float_status *)fpstp;
  fpstp_local._0_4_ = input;
  f32_exp = float32_squash_input_denormal_aarch64(input,(float_status *)fpstp);
  f32_sign = f32_exp;
  f32_frac = float32_is_neg(f32_exp);
  local_30 = extract32(f32_exp,0x17,8);
  uVar1 = extract32(f32_exp,0,0x17);
  iVar2 = float32_is_any_nan(f32_sign);
  if (iVar2 == 0) {
    iVar2 = float32_is_zero(f32_sign);
    if (iVar2 == 0) {
      iVar2 = float32_is_neg(f32_sign);
      if (iVar2 == 0) {
        iVar2 = float32_is_infinity(f32_sign);
        if (iVar2 == 0) {
          uVar3 = recip_sqrt_estimate((int *)&local_30,0x17c,(ulong)uVar1 << 0x1d);
          f32_exp = deposit32(0,0x1f,1,f32_frac);
          uVar1 = deposit32(f32_exp,0x17,8,local_30);
          f32_exp = uVar1;
          uVar3 = extract64(uVar3,0x2c,8);
          fpstp_local._4_4_ = deposit32(uVar1,0xf,8,(uint32_t)uVar3);
        }
        else {
          fpstp_local._4_4_ = 0;
        }
      }
      else {
        float_raise_aarch64('\x01',_val);
        fpstp_local._4_4_ = float32_default_nan_aarch64(_val);
      }
    }
    else {
      float_raise_aarch64('\x04',_val);
      iVar2 = float32_is_neg(f32_sign);
      fpstp_local._4_4_ = float32_set_sign(0x7f800000,iVar2);
    }
  }
  else {
    local_44 = f32_sign;
    iVar2 = float32_is_signaling_nan_aarch64(f32_sign,_val);
    if (iVar2 != 0) {
      float_raise_aarch64('\x01',_val);
      local_44 = float32_silence_nan_aarch64(f32_sign,_val);
    }
    if (_val->default_nan_mode != '\0') {
      local_44 = float32_default_nan_aarch64(_val);
    }
    fpstp_local._4_4_ = local_44;
  }
  return fpstp_local._4_4_;
}

Assistant:

float32 HELPER(rsqrte_f32)(float32 input, void *fpstp)
{
    float_status *s = fpstp;
    float32 f32 = float32_squash_input_denormal(input, s);
    uint32_t val = float32_val(f32);
    uint32_t f32_sign = float32_is_neg(f32);
    int f32_exp = extract32(val, 23, 8);
    uint32_t f32_frac = extract32(val, 0, 23);
    uint64_t f64_frac;

    if (float32_is_any_nan(f32)) {
        float32 nan = f32;
        if (float32_is_signaling_nan(f32, s)) {
            float_raise(float_flag_invalid, s);
            nan = float32_silence_nan(f32, s);
        }
        if (s->default_nan_mode) {
            nan =  float32_default_nan(s);
        }
        return nan;
    } else if (float32_is_zero(f32)) {
        float_raise(float_flag_divbyzero, s);
        return float32_set_sign(float32_infinity, float32_is_neg(f32));
    } else if (float32_is_neg(f32)) {
        float_raise(float_flag_invalid, s);
        return float32_default_nan(s);
    } else if (float32_is_infinity(f32)) {
        return float32_zero;
    }

    /* Scale and normalize to a double-precision value between 0.25 and 1.0,
     * preserving the parity of the exponent.  */

    f64_frac = ((uint64_t) f32_frac) << 29;

    f64_frac = recip_sqrt_estimate(&f32_exp, 380, f64_frac);

    /* result = sign : result_exp<4:0> : estimate<7:0> : Zeros(15) */
    val = deposit32(0, 31, 1, f32_sign);
    val = deposit32(val, 23, 8, f32_exp);
    val = deposit32(val, 15, 8, extract64(f64_frac, 52 - 8, 8));
    return make_float32(val);
}